

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O3

qpdf_data qpdfjob_create_qpdf(qpdfjob_handle j)

{
  _qpdf_data *this;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf;
  QPDFJob local_60 [4];
  
  QUtil::setLineBuf(_stdout);
  QPDFJob::createQPDF(local_60);
  if (local_60[0].m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this = (_qpdf_data *)0x0;
  }
  else {
    this = (_qpdf_data *)operator_new(0x148);
    _qpdf_data::_qpdf_data(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_60);
  }
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)local_60);
  return this;
}

Assistant:

qpdf_data
qpdfjob_create_qpdf(qpdfjob_handle j)
{
    QUtil::setLineBuf(stdout);
    try {
        auto qpdf = j->j.createQPDF();
        return qpdf ? new _qpdf_data(std::move(qpdf)) : nullptr;
    } catch (std::exception& e) {
        *j->j.getLogger()->getError() << j->j.getMessagePrefix() << ": " << e.what() << "\n";
    }
    return nullptr;
}